

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clipper.cpp
# Opt level: O1

void __thiscall Clipper::RemoveClipRange(Clipper *this,angle_t start,angle_t end)

{
  angle_t *paVar1;
  uint uVar2;
  ClipNode *pCVar3;
  
  pCVar3 = this->silhouette;
  if (pCVar3 != (ClipNode *)0x0) {
    do {
      uVar2 = pCVar3->end;
      if (start < uVar2) {
        if (pCVar3->start <= start) {
          if (end <= uVar2) {
            return;
          }
          pCVar3 = pCVar3->next;
          start = uVar2;
        }
        goto LAB_004382c9;
      }
      pCVar3 = pCVar3->next;
    } while (pCVar3 != (ClipNode *)0x0);
    pCVar3 = (ClipNode *)0x0;
LAB_004382c9:
    for (; (pCVar3 != (ClipNode *)0x0 && (pCVar3->start < end)); pCVar3 = pCVar3->next) {
      DoRemoveClipRange(this,start,pCVar3->start);
      paVar1 = &pCVar3->end;
      start = *paVar1;
    }
    if (end <= start) {
      return;
    }
  }
  DoRemoveClipRange(this,start,end);
  return;
}

Assistant:

void Clipper::RemoveClipRange(angle_t start, angle_t end)
{
	ClipNode *node;

	if (silhouette)
	{
		node = silhouette;
		while (node != NULL && node->end <= start)
		{
			node = node->next;
		}
		if (node != NULL && node->start <= start)
		{
			if (node->end >= end) return;
			start = node->end;
			node = node->next;
		}
		while (node != NULL && node->start < end)
		{
			DoRemoveClipRange(start, node->start);
			start = node->end;
			node = node->next;
		}
		if (start >= end) return;
	}
	DoRemoveClipRange(start, end);
}